

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

bool libcellml::isEuropeanNumericCharacter(char c)

{
  const_iterator cVar1;
  initializer_list<char> __l;
  allocator_type local_53;
  less<char> local_52;
  char c_local;
  char local_50 [16];
  set<char,_std::less<char>,_std::allocator<char>_> validIntegerCharacters;
  
  builtin_strncpy(local_50,"0123456789",10);
  __l._M_len = 10;
  __l._M_array = local_50;
  c_local = c;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&validIntegerCharacters._M_t,__l,
             &local_52,&local_53);
  cVar1 = std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          find(&validIntegerCharacters._M_t,&c_local);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&validIntegerCharacters._M_t);
  return (_Rb_tree_header *)cVar1._M_node !=
         &validIntegerCharacters._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool isEuropeanNumericCharacter(char c)
{
    const std::set<char> validIntegerCharacters = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9'};
    return validIntegerCharacters.find(c) != validIntegerCharacters.end();
}